

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

string * list_builtin_chat_templates_abi_cxx11_(void)

{
  bool bVar1;
  char **ppcVar2;
  size_type sVar3;
  ostream *poVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar5;
  char *pcVar6;
  string *in_RDI;
  char **tmpl;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  ostringstream msg;
  int32_t res;
  vector<const_char_*,_std::allocator<const_char_*>_> supported_tmpl;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffde8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffdf0;
  vector<const_char_*,_std::allocator<const_char_*>_> *this;
  size_type in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_1c0;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_1b8;
  ostringstream local_1b0 [396];
  undefined4 local_24;
  vector<const_char_*,_std::allocator<const_char_*>_> local_20;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x19bf99);
  local_24 = llama_chat_builtin_templates(0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
            );
  this = &local_20;
  ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x19bfdf);
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(this);
  local_24 = llama_chat_builtin_templates(ppcVar2,sVar3);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  local_1b8 = &local_20;
  local_1c0._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                          (in_stack_fffffffffffffde8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::end(in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffdf0,
                       (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    in_stack_fffffffffffffdf0 =
         (vector<const_char_*,_std::allocator<const_char_*>_> *)
         __gnu_cxx::
         __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
         ::operator*(&local_1c0);
    poVar4 = std::operator<<((ostream *)local_1b0,
                             (char *)(in_stack_fffffffffffffdf0->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
    pvVar5 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
             std::vector<const_char_*,_std::allocator<const_char_*>_>::back
                       (in_stack_fffffffffffffdf0);
    pcVar6 = ", ";
    if (in_stack_fffffffffffffdf0 == pvVar5) {
      pcVar6 = "";
    }
    std::operator<<(poVar4,pcVar6);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++(&local_1c0);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(this);
  return in_RDI;
}

Assistant:

static std::string list_builtin_chat_templates() {
    std::vector<const char *> supported_tmpl;
    int32_t res = llama_chat_builtin_templates(nullptr, 0);
    supported_tmpl.resize(res);
    res = llama_chat_builtin_templates(supported_tmpl.data(), supported_tmpl.size());
    std::ostringstream msg;
    for (auto & tmpl : supported_tmpl) {
        msg << tmpl << (&tmpl == &supported_tmpl.back() ? "" : ", ");
    }
    return msg.str();
}